

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O2

void __thiscall
sglr::GLContext::genFramebuffers(GLContext *this,int numFramebuffers,deUint32 *framebuffers)

{
  glu::CallLogWrapper::glGenFramebuffers(this->m_wrapper,numFramebuffers,framebuffers);
  if (0 < numFramebuffers) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_range_unique<unsigned_int*>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&this->m_allocatedFbos,framebuffers,framebuffers + (uint)numFramebuffers);
    return;
  }
  return;
}

Assistant:

void GLContext::genFramebuffers (int numFramebuffers, deUint32* framebuffers)
{
	m_wrapper->glGenFramebuffers(numFramebuffers, framebuffers);
	if (numFramebuffers > 0)
		m_allocatedFbos.insert(framebuffers, framebuffers+numFramebuffers);
}